

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

monster_base * lookup_monster_base(char *name)

{
  int iVar1;
  monster_base *local_20;
  monster_base *base;
  char *name_local;
  
  local_20 = rb_info;
  while( true ) {
    if (local_20 == (monster_base *)0x0) {
      return (monster_base *)0x0;
    }
    iVar1 = strcmp(name,local_20->name);
    if (iVar1 == 0) break;
    local_20 = local_20->next;
  }
  return local_20;
}

Assistant:

struct monster_base *lookup_monster_base(const char *name)
{
	struct monster_base *base;

	/* Look for it */
	for (base = rb_info; base; base = base->next) {
		if (streq(name, base->name))
			return base;
	}

	return NULL;
}